

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexFilters.cpp
# Opt level: O0

PtexFilter * Ptex::v2_2::PtexFilter::getFilter(PtexTexture *tex,Options *opts)

{
  int iVar1;
  long in_RSI;
  long *in_RDI;
  undefined4 in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  Options *in_stack_ffffffffffffff80;
  PtexTexture *in_stack_ffffffffffffff88;
  PtexBicubicFilter *in_stack_ffffffffffffff90;
  PtexBicubicFilter *local_8;
  
  iVar1 = (**(code **)(*in_RDI + 0x28))();
  if (iVar1 == 0) {
    if (*(int *)(in_RSI + 4) == 0) {
      local_8 = (PtexBicubicFilter *)operator_new(0x10);
      PtexPointFilterTri::PtexPointFilterTri
                ((PtexPointFilterTri *)in_stack_ffffffffffffff80,
                 (PtexTexture *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    else {
      local_8 = (PtexBicubicFilter *)operator_new(0x48);
      PtexTriangleFilter::PtexTriangleFilter
                ((PtexTriangleFilter *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 (Options *)local_8);
    }
  }
  else if (iVar1 == 1) {
    switch(*(undefined4 *)(in_RSI + 4)) {
    case 0:
      local_8 = (PtexBicubicFilter *)operator_new(0x10);
      PtexPointFilter::PtexPointFilter
                ((PtexPointFilter *)in_stack_ffffffffffffff80,
                 (PtexTexture *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      break;
    case 1:
      local_8 = (PtexBicubicFilter *)operator_new(0x50);
      PtexBilinearFilter::PtexBilinearFilter
                ((PtexBilinearFilter *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 in_stack_ffffffffffffff80);
      break;
    default:
      local_8 = (PtexBicubicFilter *)operator_new(0x50);
      PtexBoxFilter::PtexBoxFilter
                ((PtexBoxFilter *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 in_stack_ffffffffffffff80);
      break;
    case 3:
      local_8 = (PtexBicubicFilter *)operator_new(0x60);
      PtexGaussianFilter::PtexGaussianFilter
                ((PtexGaussianFilter *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 in_stack_ffffffffffffff80);
      break;
    case 4:
      local_8 = (PtexBicubicFilter *)operator_new(0x80);
      PtexBicubicFilter::PtexBicubicFilter
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff7c);
      break;
    case 5:
      local_8 = (PtexBicubicFilter *)operator_new(0x80);
      PtexBicubicFilter::PtexBicubicFilter
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff7c);
      break;
    case 6:
      local_8 = (PtexBicubicFilter *)operator_new(0x80);
      PtexBicubicFilter::PtexBicubicFilter
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff7c);
      break;
    case 7:
      local_8 = (PtexBicubicFilter *)operator_new(0x80);
      PtexBicubicFilter::PtexBicubicFilter
                (local_8,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff7c);
    }
  }
  else {
    local_8 = (PtexBicubicFilter *)0x0;
  }
  return (PtexFilter *)local_8;
}

Assistant:

PtexFilter* PtexFilter::getFilter(PtexTexture* tex, const PtexFilter::Options& opts)
{
    switch (tex->meshType()) {
    case Ptex::mt_quad:
        switch (opts.filter) {
        case f_point:       return new PtexPointFilter(tex);
        case f_bilinear:    return new PtexBilinearFilter(tex, opts);
        default:
        case f_box:         return new PtexBoxFilter(tex, opts);
        case f_gaussian:    return new PtexGaussianFilter(tex, opts);
        case f_bicubic:     return new PtexBicubicFilter(tex, opts, opts.sharpness);
        case f_bspline:     return new PtexBicubicFilter(tex, opts, 0.f);
        case f_catmullrom:  return new PtexBicubicFilter(tex, opts, 1.f);
        case f_mitchell:    return new PtexBicubicFilter(tex, opts, 2.f/3.f);
        }
        break;

    case Ptex::mt_triangle:
        switch (opts.filter) {
        case f_point:       return new PtexPointFilterTri(tex);
        default:            return new PtexTriangleFilter(tex, opts);
        }
        break;
    }
    return 0;
}